

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O1

void __thiscall
TasGrid::GridLocalPolynomial::applyTransformationTransposed<1,(TasGrid::RuleLocal::erule)3>
          (GridLocalPolynomial *this,double *weights,MultiIndexSet *work,
          vector<int,_std::allocator<int>_> *active_points)

{
  int iVar1;
  size_t sVar2;
  pointer piVar3;
  void *pvVar4;
  Data2D<int> *pDVar5;
  _Bit_type *p_Var6;
  int iVar7;
  long lVar8;
  pointer piVar9;
  Data2D<int> *pDVar10;
  long lVar11;
  _Bit_type *p_Var12;
  long lVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  GridLocalPolynomial *pGVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  int iVar25;
  double dVar26;
  vector<bool,_std::allocator<bool>_> used;
  vector<double,_std::allocator<double>_> node;
  vector<int,_std::allocator<int>_> monkey_count;
  vector<int,_std::allocator<int>_> monkey_tail;
  vector<int,_std::allocator<int>_> level;
  Data2D<int> lparents;
  allocator_type local_149;
  ulong local_148;
  int local_13c;
  GridLocalPolynomial *local_138;
  MultiIndexSet *local_130;
  int local_124;
  ulong local_120;
  vector<bool,_std::allocator<bool>_> local_118;
  int local_ec;
  vector<double,_std::allocator<double>_> local_e8;
  vector<int,_std::allocator<int>_> local_d0;
  vector<int,_std::allocator<int>_> local_b8;
  vector<int,_std::allocator<int>_> local_a0;
  Data2D<int> local_88;
  double *local_58;
  vector<int,_std::allocator<int>_> *local_50;
  ulong local_48;
  ulong local_40;
  double local_38;
  
  local_138 = this;
  local_130 = work;
  local_58 = weights;
  if (work->cache_num_indexes == (int)(this->parents).num_strips) {
    local_88.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_88.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_88.stride = 0;
    local_88.num_strips = 0;
    local_88.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
  }
  else {
    HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)3>(&local_88,work);
  }
  iVar25 = (int)(local_138->parents).num_strips;
  local_13c = local_130->cache_num_indexes;
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_a0,
             (long)(active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_118);
  pGVar19 = local_138;
  piVar9 = (active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar8 = (long)(active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar9;
  if (lVar8 == 0) {
    local_148 = 0;
  }
  else {
    lVar8 = lVar8 >> 2;
    sVar2 = local_130->num_dimensions;
    piVar3 = (local_130->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_148 = 0;
    lVar13 = 0;
    do {
      lVar21 = (long)piVar9[lVar13] * sVar2;
      uVar17 = piVar3[lVar21] + 1;
      uVar14 = 0;
      if (1 < uVar17) {
        uVar14 = 0;
        do {
          uVar17 = (int)uVar17 >> 1;
          uVar14 = uVar14 + 1;
        } while (1 < uVar17);
      }
      lVar18 = (long)(local_138->super_BaseCanonicalGrid).num_dimensions;
      if (1 < lVar18) {
        lVar11 = 1;
        do {
          uVar17 = piVar3[lVar21 + lVar11] + 1;
          iVar23 = 0;
          if (1 < uVar17) {
            iVar23 = 0;
            do {
              uVar17 = (int)uVar17 >> 1;
              iVar23 = iVar23 + 1;
            } while (1 < uVar17);
          }
          uVar14 = uVar14 + iVar23;
          lVar11 = lVar11 + 1;
        } while (lVar11 != lVar18);
      }
      if ((int)local_148 <= (int)uVar14) {
        local_148 = (ulong)uVar14;
      }
      local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar13] = uVar14;
      lVar13 = lVar13 + 1;
    } while (lVar13 != lVar8 + (ulong)(lVar8 == 0));
  }
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_d0,(long)local_138->top_level + 1,(allocator_type *)&local_118);
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_b8,(long)pGVar19->top_level + 1,(allocator_type *)&local_118);
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = 0;
  ::std::vector<bool,_std::allocator<bool>_>::vector
            (&local_118,(long)local_130->cache_num_indexes,(bool *)&local_e8,&local_149);
  iVar23 = (local_138->super_BaseCanonicalGrid).num_dimensions;
  ::std::vector<double,_std::allocator<double>_>::vector
            (&local_e8,(long)iVar23,(allocator_type *)&local_149);
  if (0 < (int)local_148) {
    local_50 = active_points;
    pGVar19 = local_138;
    iVar20 = local_13c;
    local_124 = iVar23;
    local_ec = iVar25;
    do {
      piVar9 = (active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish != piVar9) {
        uVar22 = 0;
        do {
          uVar14 = local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
          p_Var6 = local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
          local_120 = uVar22;
          if (local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar22] == (int)local_148) {
            lVar8 = (long)(pGVar19->super_BaseCanonicalGrid).num_dimensions;
            if (0 < lVar8) {
              iVar23 = piVar9[uVar22];
              sVar2 = local_130->num_dimensions;
              piVar3 = (local_130->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar13 = 0;
              do {
                iVar7 = piVar3[(long)iVar23 * sVar2 + lVar13];
                uVar17 = iVar7 + 1;
                dVar26 = 1.0;
                if (1 < uVar17) {
                  iVar15 = 1;
                  do {
                    uVar17 = (int)uVar17 >> 1;
                    iVar15 = iVar15 * 2;
                  } while (1 < uVar17);
                  dVar26 = (double)iVar15;
                }
                *(double *)
                 (CONCAT71(local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,
                           local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start._0_1_) + lVar13 * 8) =
                     (double)(iVar7 * 2 + 3) / dVar26 + -3.0;
                lVar13 = lVar13 + 1;
              } while (lVar13 != lVar8);
            }
            p_Var12 = local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            if (local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
                local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) {
              memset(local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,0,
                     (long)local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                     (long)local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
              p_Var12 = p_Var6;
              pGVar19 = local_138;
              iVar20 = local_13c;
            }
            if (uVar14 != 0) {
              *p_Var12 = *p_Var12 & ~(0xffffffffffffffffU >> (-(char)uVar14 & 0x3fU));
            }
            *local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start = 0;
            *local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start = (active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[local_120];
            if (*local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start < local_124) {
              iVar7 = 0;
              iVar23 = local_124;
              do {
                iVar15 = local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar7];
                if (iVar15 < iVar23) {
                  pDVar10 = &pGVar19->parents;
                  if (iVar20 != iVar25) {
                    pDVar10 = &local_88;
                  }
                  pDVar5 = &pGVar19->parents;
                  if (iVar20 != iVar25) {
                    pDVar5 = &local_88;
                  }
                  iVar1 = *(int *)((long)local_b8.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start[iVar7] *
                                   pDVar10->stride * 4 +
                                   (long)(pDVar5->vec).super__Vector_base<int,_std::allocator<int>_>
                                         ._M_impl.super__Vector_impl_data._M_start +
                                  (long)iVar15 * 4);
                  uVar22 = (ulong)iVar1;
                  if (uVar22 != 0xffffffffffffffff) {
                    uVar24 = uVar22 + 0x3f;
                    if (-1 < (long)uVar22) {
                      uVar24 = uVar22;
                    }
                    uVar16 = (ulong)((uVar22 & 0x800000000000003f) < 0x8000000000000001);
                    if ((local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [((long)uVar24 >> 6) + (uVar16 - 1)] >> (uVar22 & 0x3f) & 1) == 0) {
                      lVar8 = local_130->num_dimensions * uVar22;
                      piVar3 = (local_130->indexes).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                      local_48 = 1L << ((byte)iVar1 & 0x3f);
                      local_40 = uVar16;
                      dVar26 = RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)3>
                                         (pGVar19->order,piVar3[lVar8],
                                          *(double *)
                                           CONCAT71(local_e8.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  local_e8.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_));
                      uVar14 = (pGVar19->super_BaseCanonicalGrid).num_dimensions;
                      if (1 < (int)uVar14) {
                        lVar13 = 1;
                        do {
                          local_38 = dVar26;
                          dVar26 = RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)3>
                                             (pGVar19->order,piVar3[lVar8 + lVar13],
                                              *(double *)
                                               (CONCAT71(local_e8.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  local_e8.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                                               lVar13 * 8));
                          dVar26 = local_38 * dVar26;
                          lVar13 = lVar13 + 1;
                          uVar14 = (pGVar19->super_BaseCanonicalGrid).num_dimensions;
                        } while (lVar13 < (int)uVar14);
                      }
                      if (0 < (int)uVar14) {
                        iVar25 = (local_50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start[local_120];
                        uVar22 = 0;
                        do {
                          local_58[(long)(int)(uVar14 * iVar1) + uVar22] =
                               local_58[(long)(int)(uVar14 * iVar1) + uVar22] -
                               local_58[(long)(int)uVar14 * (long)iVar25 + uVar22] * dVar26;
                          uVar22 = uVar22 + 1;
                        } while (uVar14 != uVar22);
                      }
                      local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                      [((long)uVar24 >> 6) + (local_40 - 1)] =
                           local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                           [((long)uVar24 >> 6) + (local_40 - 1)] | local_48;
                      local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)iVar7 + 1] = 0;
                      local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)iVar7 + 1] = iVar1;
                      active_points = local_50;
                      iVar25 = local_ec;
                      iVar20 = local_13c;
                      iVar23 = local_124;
                      iVar7 = iVar7 + 1;
                      goto LAB_0019c82b;
                    }
                  }
                  local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar7] = iVar15 + 1;
                }
                else {
                  local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)iVar7 + -1] =
                       local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)iVar7 + -1] + 1;
                  iVar7 = iVar7 + -1;
                }
LAB_0019c82b:
              } while (*local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start < iVar23);
            }
          }
          uVar22 = local_120 + 1;
          piVar9 = (active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        } while (uVar22 < (ulong)((long)(active_points->
                                        super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                        super__Vector_impl_data._M_finish - (long)piVar9 >> 2));
      }
      iVar23 = (int)local_148;
      local_148 = (ulong)(iVar23 - 1);
    } while (1 < iVar23);
  }
  pvVar4 = (void *)CONCAT71(local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_,
                            local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,(long)local_e8.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar4);
  }
  if (local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (ulong *)0x0) {
    operator_delete(local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (ulong *)0x0;
    local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (ulong *)0x0;
    local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_88.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GridLocalPolynomial::applyTransformationTransposed(double weights[], const MultiIndexSet &work, const std::vector<int> &active_points) const {
    Data2D<int> lparents = (parents.getNumStrips() != work.getNumIndexes()) ? // if the current dag loaded in parents does not reflect the indexes in work
                            HierarchyManipulations::computeDAGup<effrule>(work) :
                            Data2D<int>();

    const Data2D<int> &dagUp = (parents.getNumStrips() != work.getNumIndexes()) ? lparents : parents;

    std::vector<int> level(active_points.size());
    int active_top_level = 0;
    for(size_t i=0; i<active_points.size(); i++){
        const int *p = work.getIndex(active_points[i]);
        int current_level = RuleLocal::getLevel<effrule>(p[0]);
        for(int j=1; j<num_dimensions; j++){
            current_level += RuleLocal::getLevel<effrule>(p[j]);
        }
        if (active_top_level < current_level) active_top_level = current_level;
        level[i] = current_level;
    }

    std::vector<int> monkey_count(top_level+1);
    std::vector<int> monkey_tail(top_level+1);
    std::vector<bool> used(work.getNumIndexes());
    int max_parents = RuleLocal::getMaxNumParents<effrule>() * num_dimensions;

    std::vector<double> node(num_dimensions);

    for(int l=active_top_level; l>0; l--){
        for(size_t i=0; i<active_points.size(); i++){
            if (level[i] == l){
                int const *pnt = work.getIndex(active_points[i]);
                for(int j=0; j<num_dimensions; j++)
                    node[j] = RuleLocal::getNode<effrule>(pnt[j]);

                std::fill(used.begin(), used.end(), false);

                monkey_count[0] = 0;
                monkey_tail[0] = active_points[i];
                int current = 0;

                while(monkey_count[0] < max_parents){
                    if (monkey_count[current] < max_parents){
                        int branch = dagUp.getStrip(monkey_tail[current])[monkey_count[current]];
                        if ((branch == -1) || used[branch]){
                            monkey_count[current]++;
                        }else{
                            const int *func = work.getIndex(branch);
                            double basis_value = RuleLocal::evalRaw<effrule>(order, func[0], node[0]);
                            for(int j=1; j<num_dimensions; j++) basis_value *= RuleLocal::evalRaw<effrule>(order, func[j], node[j]);

                            if (mode == 0) {
                                weights[branch] -= weights[active_points[i]] * basis_value;
                            } else {
                                for (int d=0; d<num_dimensions; d++)
                                    weights[branch * num_dimensions + d] -=
                                            weights[active_points[i] * num_dimensions + d] * basis_value;
                            }
                            used[branch] = true;

                            monkey_count[++current] = 0;
                            monkey_tail[current] = branch;
                        }
                    }else{
                        monkey_count[--current]++;
                    }
                }
            }
        }
    }
}